

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O0

ssize_t __thiscall
duckdb_parquet::UUIDType::read(UUIDType *this,int __fd,void *__buf,size_t __nbytes)

{
  uint32_t uVar1;
  uint uVar2;
  undefined4 in_register_00000034;
  int16_t fid;
  TType ftype;
  string fname;
  uint32_t xfer;
  TInputRecursionTracker tracker;
  undefined4 in_stack_ffffffffffffff88;
  TType in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  uint32_t in_stack_ffffffffffffff94;
  uint32_t in_stack_ffffffffffffff98;
  uint32_t in_stack_ffffffffffffff9c;
  TProtocol *this_00;
  int local_44;
  TProtocol local_40;
  undefined8 local_10;
  UUIDType *local_8;
  
  local_10 = CONCAT44(in_register_00000034,__fd);
  local_8 = this;
  duckdb_apache::thrift::protocol::TInputRecursionTracker::TInputRecursionTracker
            ((TInputRecursionTracker *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)
             ,(TProtocol *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  local_40._36_4_ = 0;
  this_00 = &local_40;
  std::__cxx11::string::string((string *)this_00);
  uVar1 = duckdb_apache::thrift::protocol::TProtocol::readStructBegin
                    ((TProtocol *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                     (string *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  local_40._36_4_ = uVar1 + local_40._36_4_;
  while( true ) {
    in_stack_ffffffffffffff9c =
         duckdb_apache::thrift::protocol::TProtocol::readFieldBegin
                   (this_00,(string *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                    (TType *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                    (int16_t *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    local_40._36_4_ = in_stack_ffffffffffffff9c + local_40._36_4_;
    if (local_44 == 0) break;
    in_stack_ffffffffffffff98 =
         duckdb_apache::thrift::protocol::TProtocol::skip
                   ((TProtocol *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                    in_stack_ffffffffffffff8c);
    local_40._36_4_ = local_40._36_4_ + in_stack_ffffffffffffff98;
    in_stack_ffffffffffffff94 =
         duckdb_apache::thrift::protocol::TProtocol::readFieldEnd((TProtocol *)0x6f64fe);
    local_40._36_4_ = in_stack_ffffffffffffff94 + local_40._36_4_;
  }
  uVar1 = duckdb_apache::thrift::protocol::TProtocol::readStructEnd((TProtocol *)0x6f651f);
  uVar2 = uVar1 + local_40._36_4_;
  local_40._36_4_ = uVar2;
  std::__cxx11::string::~string((string *)&local_40);
  duckdb_apache::thrift::protocol::TInputRecursionTracker::~TInputRecursionTracker
            ((TInputRecursionTracker *)0x6f654d);
  return (ulong)uVar2;
}

Assistant:

uint32_t UUIDType::read(::apache::thrift::protocol::TProtocol* iprot) {

  ::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);
  uint32_t xfer = 0;
  std::string fname;
  ::apache::thrift::protocol::TType ftype;
  int16_t fid;

  xfer += iprot->readStructBegin(fname);

  using ::apache::thrift::protocol::TProtocolException;


  while (true)
  {
    xfer += iprot->readFieldBegin(fname, ftype, fid);
    if (ftype == ::apache::thrift::protocol::T_STOP) {
      break;
    }
    xfer += iprot->skip(ftype);
    xfer += iprot->readFieldEnd();
  }

  xfer += iprot->readStructEnd();

  return xfer;
}